

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O0

Vec_Int_t * Abc_SclFindMinAreas(SC_Lib *pLib,int fUseMax)

{
  int iVar1;
  Vec_Int_t *p;
  SC_Cell *pRepr_00;
  SC_Cell *local_50;
  int local_40;
  int local_3c;
  int k;
  int i;
  SC_Cell *pBest;
  SC_Cell *pRepr;
  SC_Cell *pCell;
  Vec_Int_t *vMinCells;
  int fUseMax_local;
  SC_Lib *pLib_local;
  
  iVar1 = Vec_PtrSize(&pLib->vCells);
  p = Vec_IntStartFull(iVar1);
  for (local_3c = 0; iVar1 = Vec_PtrSize(&pLib->vCellClasses), local_3c < iVar1;
      local_3c = local_3c + 1) {
    pRepr_00 = (SC_Cell *)Vec_PtrEntry(&pLib->vCellClasses,local_3c);
    local_50 = pRepr_00;
    if (fUseMax != 0) {
      local_50 = Abc_SclFindMaxAreaCell(pRepr_00);
    }
    pRepr = pRepr_00;
    for (local_40 = 0; local_40 == 0 || pRepr != pRepr_00; local_40 = local_40 + 1) {
      Vec_IntWriteEntry(p,pRepr->Id,local_50->Id);
      pRepr = pRepr->pNext;
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_SclFindMinAreas( SC_Lib * pLib, int fUseMax )
{
    Vec_Int_t * vMinCells;
    SC_Cell * pCell, * pRepr = NULL, * pBest = NULL;
    int i, k;
    // map each gate in the library into its min/max-size prototype
    vMinCells = Vec_IntStartFull( Vec_PtrSize(&pLib->vCells) );
    SC_LibForEachCellClass( pLib, pRepr, i )
    {
        pBest = fUseMax ? Abc_SclFindMaxAreaCell(pRepr) : pRepr;
        SC_RingForEachCell( pRepr, pCell, k )
            Vec_IntWriteEntry( vMinCells, pCell->Id, pBest->Id );
    }
    return vMinCells;
}